

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::ULTRA_HIGH(Parser *this)

{
  Lex local_24;
  
  ULTRA_ULTRA_HIGH(this);
  while ((this->c_type & ~LEX_AND) == LEX_TIMES) {
    Lex::Lex(&local_24,this->c_type,0,0);
    std::deque<Lex,_std::allocator<Lex>_>::emplace_back<Lex>(&(this->lex_stack).c,&local_24);
    Lex::~Lex(&local_24);
    get_lex(this);
    ULTRA_ULTRA_HIGH(this);
    check_op(this);
  }
  return;
}

Assistant:

void Parser::ULTRA_HIGH() {
    ULTRA_ULTRA_HIGH();
    while ( c_type == LEX_TIMES || c_type == LEX_SLASH) {
        lex_stack.push (c_type);
        get_lex();
        ULTRA_ULTRA_HIGH();
        check_op();
    }
}